

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O2

void av1_quantize_lp_sse2
               (int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
               int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,
               int16_t *scan,int16_t *iscan)

{
  int16_t *coeff_ptr_00;
  int16_t *qcoeff_ptr_00;
  int16_t *dqcoeff_ptr_00;
  short sVar1;
  long n_coeffs_00;
  int16_t *iscan_ptr;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  __m128i *in_stack_ffffffffffffff48;
  __m128i eob;
  __m128i dequant0;
  __m128i quant1;
  __m128i quant0;
  __m128i round1;
  __m128i dequant1;
  __m128i round0;
  short sVar2;
  short sVar5;
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  
  coeff_ptr_00 = coeff_ptr + n_coeffs;
  iscan_ptr = iscan + n_coeffs;
  qcoeff_ptr_00 = qcoeff_ptr + n_coeffs;
  dqcoeff_ptr_00 = dqcoeff_ptr + n_coeffs;
  round0 = *(__m128i *)round_ptr;
  round1[1]._0_4_ = (undefined4)round0[1];
  round1[1]._4_4_ = round0[1]._4_4_;
  round1[0] = round0[1];
  dequant0 = *(__m128i *)dequant_ptr;
  dequant1[1]._0_4_ = (undefined4)dequant0[1];
  dequant1[1]._4_4_ = dequant0[1]._4_4_;
  dequant1[0] = dequant0[1];
  eob[0] = 0;
  eob[1] = 0;
  quantize_lp(iscan_ptr,coeff_ptr_00,-n_coeffs,qcoeff_ptr_00,dqcoeff_ptr_00,&round0,&dequant0,
              &dequant1,&eob,in_stack_ffffffffffffff48,(__m128i *)n_coeffs,(__m128i *)0x0);
  n_coeffs_00 = -n_coeffs;
  while (n_coeffs_00 = n_coeffs_00 + 0x10, n_coeffs_00 < 0) {
    quantize_lp(iscan_ptr,coeff_ptr_00,n_coeffs_00,qcoeff_ptr_00,dqcoeff_ptr_00,&round1,&dequant1,
                &dequant1,&eob,in_stack_ffffffffffffff48,(__m128i *)n_coeffs,(__m128i *)eob[0]);
  }
  sVar2 = (short)eob[0];
  sVar6 = (short)eob[1];
  auVar7._0_2_ = (ushort)(sVar6 < sVar2) * sVar2 | (ushort)(sVar6 >= sVar2) * sVar6;
  sVar5 = eob[0]._2_2_;
  sVar8 = eob[1]._2_2_;
  auVar7._2_2_ = (ushort)(sVar8 < sVar5) * sVar5 | (ushort)(sVar8 >= sVar5) * sVar8;
  sVar1 = eob[0]._4_2_;
  sVar9 = eob[1]._4_2_;
  auVar7._4_2_ = (ushort)(sVar9 < sVar1) * sVar1 | (ushort)(sVar9 >= sVar1) * sVar9;
  sVar1 = eob[0]._6_2_;
  sVar10 = eob[1]._6_2_;
  auVar7._6_2_ = (ushort)(sVar10 < sVar1) * sVar1 | (ushort)(sVar10 >= sVar1) * sVar10;
  auVar7._8_2_ = (ushort)(sVar2 < sVar6) * sVar6 | (ushort)(sVar2 >= sVar6) * sVar2;
  auVar7._10_2_ = (ushort)(sVar5 < sVar8) * sVar8 | (ushort)(sVar5 >= sVar8) * sVar5;
  auVar7._12_2_ = (ushort)(sVar2 < sVar9) * sVar9 | (ushort)(sVar2 >= sVar9) * sVar2;
  auVar7._14_2_ = (ushort)(sVar5 < sVar10) * sVar10 | (ushort)(sVar5 >= sVar10) * sVar5;
  auVar3 = pshuflw((undefined1  [16])eob,auVar7,0xe);
  sVar2 = auVar3._0_2_;
  auVar4._0_2_ = (sVar2 < (short)auVar7._0_2_) * auVar7._0_2_ |
                 (ushort)(sVar2 >= (short)auVar7._0_2_) * sVar2;
  sVar2 = auVar3._2_2_;
  auVar4._2_2_ = (sVar2 < (short)auVar7._2_2_) * auVar7._2_2_ |
                 (ushort)(sVar2 >= (short)auVar7._2_2_) * sVar2;
  sVar2 = auVar3._4_2_;
  auVar4._4_2_ = (sVar2 < (short)auVar7._4_2_) * auVar7._4_2_ |
                 (ushort)(sVar2 >= (short)auVar7._4_2_) * sVar2;
  sVar2 = auVar3._6_2_;
  auVar4._6_2_ = (sVar2 < (short)auVar7._6_2_) * auVar7._6_2_ |
                 (ushort)(sVar2 >= (short)auVar7._6_2_) * sVar2;
  sVar2 = auVar3._8_2_;
  auVar4._8_2_ = (sVar2 < (short)auVar7._8_2_) * auVar7._8_2_ |
                 (ushort)(sVar2 >= (short)auVar7._8_2_) * sVar2;
  sVar2 = auVar3._10_2_;
  auVar4._10_2_ =
       (sVar2 < (short)auVar7._10_2_) * auVar7._10_2_ |
       (ushort)(sVar2 >= (short)auVar7._10_2_) * sVar2;
  sVar2 = auVar3._12_2_;
  sVar5 = auVar3._14_2_;
  auVar4._12_2_ =
       (sVar2 < (short)auVar7._12_2_) * auVar7._12_2_ |
       (ushort)(sVar2 >= (short)auVar7._12_2_) * sVar2;
  auVar4._14_2_ =
       (sVar5 < (short)auVar7._14_2_) * auVar7._14_2_ |
       (ushort)(sVar5 >= (short)auVar7._14_2_) * sVar5;
  auVar3 = pshuflw(auVar7,auVar4,1);
  sVar2 = auVar3._2_2_;
  *eob_ptr = (sVar2 < (short)auVar4._2_2_) * auVar4._2_2_ |
             (ushort)(sVar2 >= (short)auVar4._2_2_) * sVar2;
  return;
}

Assistant:

void av1_quantize_lp_sse2(const int16_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *round_ptr, const int16_t *quant_ptr,
                          int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  coeff_ptr += n_coeffs;
  iscan += n_coeffs;
  qcoeff_ptr += n_coeffs;
  dqcoeff_ptr += n_coeffs;
  n_coeffs = -n_coeffs;

  // Setup global values
  const __m128i round0 = _mm_load_si128((const __m128i *)round_ptr);
  const __m128i round1 = _mm_unpackhi_epi64(round0, round0);
  const __m128i quant0 = _mm_load_si128((const __m128i *)quant_ptr);
  const __m128i quant1 = _mm_unpackhi_epi64(quant0, quant0);
  const __m128i dequant0 = _mm_load_si128((const __m128i *)dequant_ptr);
  const __m128i dequant1 = _mm_unpackhi_epi64(dequant0, dequant0);
  __m128i eob = _mm_setzero_si128();

  // DC and first 15 AC
  quantize_lp(iscan, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round0,
              &round1, &quant0, &quant1, &dequant0, &dequant1, &eob);
  n_coeffs += 8 * 2;

  // AC only loop
  while (n_coeffs < 0) {
    quantize_lp(iscan, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round1,
                &round1, &quant1, &quant1, &dequant1, &dequant1, &eob);
    n_coeffs += 8 * 2;
  }

  // Accumulate EOB
  *eob_ptr = accumulate_eob(eob);
}